

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_compile.c
# Opt level: O3

uint32_t * parsed_skip(uint32_t *pptr,uint32_t skiptype)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = 0;
  do {
    uVar2 = *pptr;
    switch(uVar2 >> 0x10 ^ 0x8000) {
    case 0:
      return (uint32_t *)0x0;
    case 1:
      if (iVar1 == 0 && skiptype == 0) {
        return pptr;
      }
      break;
    case 2:
    case 8:
    case 0xf:
    case 0x10:
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x14:
    case 0x15:
    case 0x1a:
    case 0x22:
    case 0x23:
    case 0x24:
    case 0x25:
    case 0x26:
    case 0x27:
    case 0x28:
      iVar1 = iVar1 + 1;
      break;
    case 3:
      pptr = pptr + (ulong)(9 < (uVar2 & 0xfffe)) * 2;
      break;
    default:
      if ((int)uVar2 < 0) break;
      goto LAB_0018b2b6;
    case 0xd:
      if (skiptype == 1) {
        return pptr;
      }
      break;
    case 0x18:
      if ((uVar2 & 0xffff) - 0x1b < 2) {
        pptr = pptr + 3;
      }
      else if ((uVar2 & 0xffff) - 0xf < 2) {
        pptr = pptr + 1;
      }
      break;
    case 0x19:
      if (iVar1 == 0) {
        return pptr;
      }
      iVar1 = iVar1 + -1;
      break;
    case 0x29:
    case 0x2d:
    case 0x2f:
    case 0x31:
    case 0x33:
      pptr = pptr + pptr[1];
    }
    uVar2 = uVar2 >> 0x10 & 0x7fff;
    if (0x3f < uVar2) {
      return (uint32_t *)0x0;
    }
    pptr = pptr + ""[uVar2];
LAB_0018b2b6:
    pptr = pptr + 1;
  } while( true );
}

Assistant:

static uint32_t *
parsed_skip(uint32_t *pptr, uint32_t skiptype)
{
uint32_t nestlevel = 0;

for (;; pptr++)
  {
  uint32_t meta = META_CODE(*pptr);

  switch(meta)
    {
    default:  /* Just skip over most items */
    if (meta < META_END) continue;  /* Literal */
    break;

    /* This should never occur. */

    case META_END:
    return NULL;

    /* The data for these items is variable in length. */

    case META_BACKREF:  /* Offset is present only if group >= 10 */
    if (META_DATA(*pptr) >= 10) pptr += SIZEOFFSET;
    break;

    case META_ESCAPE:   /* A few escapes are followed by data items. */
    switch (META_DATA(*pptr))
      {
      case ESC_P:
      case ESC_p:
      pptr += 1;
      break;

      case ESC_g:
      case ESC_k:
      pptr += 1 + SIZEOFFSET;
      break;
      }
    break;

    case META_MARK:     /* Add the length of the name. */
    case META_COMMIT_ARG:
    case META_PRUNE_ARG:
    case META_SKIP_ARG:
    case META_THEN_ARG:
    pptr += pptr[1];
    break;

    /* These are the "active" items in this loop. */

    case META_CLASS_END:
    if (skiptype == PSKIP_CLASS) return pptr;
    break;

    case META_ATOMIC:
    case META_CAPTURE:
    case META_COND_ASSERT:
    case META_COND_DEFINE:
    case META_COND_NAME:
    case META_COND_NUMBER:
    case META_COND_RNAME:
    case META_COND_RNUMBER:
    case META_COND_VERSION:
    case META_LOOKAHEAD:
    case META_LOOKAHEADNOT:
    case META_LOOKAHEAD_NA:
    case META_LOOKBEHIND:
    case META_LOOKBEHINDNOT:
    case META_LOOKBEHIND_NA:
    case META_NOCAPTURE:
    case META_SCRIPT_RUN:
    nestlevel++;
    break;

    case META_ALT:
    if (nestlevel == 0 && skiptype == PSKIP_ALT) return pptr;
    break;

    case META_KET:
    if (nestlevel == 0) return pptr;
    nestlevel--;
    break;
    }

  /* The extra data item length for each meta is in a table. */

  meta = (meta >> 16) & 0x7fff;
  if (meta >= sizeof(meta_extra_lengths)) return NULL;
  pptr += meta_extra_lengths[meta];
  }
/* Control never reaches here */
return pptr;
}